

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

bool __thiscall
capnp::compiler::NodeTranslator::StructLayout::HoleSet<unsigned_char>::tryExpand
          (HoleSet<unsigned_char> *this,uchar oldLgSize,uint oldOffset,uint expansionFactor)

{
  bool bVar1;
  Fault f;
  DebugComparison<unsigned_char_&,_unsigned_long> _kjCondition;
  byte local_41;
  Fault local_40;
  DebugComparison<unsigned_char_&,_unsigned_long> local_38;
  
  bVar1 = true;
  if (expansionFactor != 0) {
    local_38.result = oldLgSize < 6;
    if (oldLgSize != '\x06') {
      local_38.left = &local_41;
      local_38.right = 6;
      local_38.op.content.ptr = " < ";
      local_38.op.content.size_ = 4;
      local_41 = oldLgSize;
      if (!local_38.result) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_char&,unsigned_long>&>
                  (&local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                   ,0x89,FAILED,"oldLgSize < kj::size(holes)","_kjCondition,",&local_38);
        kj::_::Debug::Fault::fatal(&local_40);
      }
      if ((oldOffset + 1 == (uint)this->holes[oldLgSize]) &&
         (bVar1 = tryExpand(this,oldLgSize + '\x01',oldOffset >> 1,expansionFactor - 1), bVar1)) {
        this->holes[local_41] = '\0';
        return true;
      }
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool tryExpand(UIntType oldLgSize, uint oldOffset, uint expansionFactor) {
      // Try to expand the value at the given location by combining it with subsequent holes, so
      // as to expand the location to be 2^expansionFactor times the size that it started as.
      // (In other words, the new lgSize is oldLgSize + expansionFactor.)

      if (expansionFactor == 0) {
        // No expansion requested.
        return true;
      }
      if (oldLgSize == kj::size(holes)) {
        // Old value is already a full word. Further expansion is impossible.
        return false;
      }
      KJ_ASSERT(oldLgSize < kj::size(holes));
      if (holes[oldLgSize] != oldOffset + 1) {
        // The space immediately after the location is not a hole.
        return false;
      }

      // We can expand the location by one factor by combining it with a hole.  Try to further
      // expand from there to the number of factors requested.
      if (tryExpand(oldLgSize + 1, oldOffset >> 1, expansionFactor - 1)) {
        // Success.  Consume the hole.
        holes[oldLgSize] = 0;
        return true;
      } else {
        return false;
      }
    }